

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_visit_parents(ggml_cgraph *cgraph,ggml_tensor *node)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  sbyte sVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  uint *extraout_RDX;
  ulong uVar18;
  ulong uVar19;
  ushort *puVar20;
  ggml_tensor *node_00;
  ggml_cgraph *pgVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  undefined2 *puVar25;
  long lVar26;
  ulong uVar27;
  size_t sVar28;
  undefined4 *puVar29;
  uint *puVar30;
  undefined1 auVar31 [16];
  long lStack_80;
  ulong uStack_70;
  
  if (0 < (long)cgraph->n_nodes) {
    lVar14 = 0;
    do {
      if (cgraph->nodes[lVar14] == node) {
        return;
      }
      lVar14 = lVar14 + 1;
    } while (cgraph->n_nodes != lVar14);
  }
  if (0 < (long)cgraph->n_leafs) {
    lVar14 = 0;
    do {
      if (cgraph->leafs[lVar14] == node) {
        return;
      }
      lVar14 = lVar14 + 1;
    } while (cgraph->n_leafs != lVar14);
  }
  pgVar21 = cgraph;
  if (node->src0 != (ggml_tensor *)0x0) {
    ggml_visit_parents(cgraph,node->src0);
  }
  if (node->src1 != (ggml_tensor *)0x0) {
    pgVar21 = cgraph;
    ggml_visit_parents(cgraph,node->src1);
  }
  lVar14 = 0xb;
  do {
    node_00 = *(ggml_tensor **)(node->ne + lVar14 * 2 + -2);
    if (node_00 != (ggml_tensor *)0x0) {
      pgVar21 = cgraph;
      ggml_visit_parents(cgraph,node_00);
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xf);
  if ((node->op == GGML_OP_NONE) && (node->grad == (ggml_tensor *)0x0)) {
    iVar1 = cgraph->n_leafs;
    if ((long)iVar1 < 0x1000) {
      cgraph->leafs[iVar1] = node;
      cgraph->n_leafs = iVar1 + 1;
      return;
    }
  }
  else {
    iVar1 = cgraph->n_nodes;
    lVar14 = (long)iVar1;
    if (lVar14 < 0x1000) {
      cgraph->nodes[lVar14] = node;
      cgraph->grads[lVar14] = node->grad;
      cgraph->n_nodes = iVar1 + 1;
      return;
    }
    ggml_visit_parents_cold_1();
  }
  ggml_visit_parents_cold_2();
  switch(node_00->type) {
  case GGML_TYPE_Q4_0:
  case GGML_TYPE_Q4_1:
  case GGML_TYPE_I8:
  case GGML_TYPE_I16:
  case GGML_TYPE_I32:
  case GGML_TYPE_COUNT:
    ggml_compute_forward_dup_cold_1();
    goto LAB_00132bb5;
  case GGML_TYPE_F16:
    if (pgVar21->n_leafs != 0) {
LAB_00132bbf:
      ggml_compute_forward_dup_cold_7();
LAB_00132bc4:
      ggml_compute_forward_dup_cold_2();
LAB_00132bc9:
      ggml_compute_forward_dup_cold_9();
LAB_00132bce:
      ggml_compute_forward_dup_cold_4();
      goto LAB_00132bd3;
    }
    uVar2 = *extraout_RDX;
    uVar18 = (ulong)uVar2;
    if (*(size_t *)(extraout_RDX + 6) != GGML_TYPE_SIZE[uVar18]) {
LAB_00132bb5:
      ggml_compute_forward_dup_cold_8();
      goto LAB_00132bba;
    }
    if (*(ulong *)(extraout_RDX + 8) !=
        (*(size_t *)(extraout_RDX + 6) * (long)(int)extraout_RDX[2]) /
        (ulong)(long)GGML_BLCK_SIZE[uVar18]) goto LAB_00132bb5;
    if ((*(long *)(extraout_RDX + 10) != *(ulong *)(extraout_RDX + 8) * (long)(int)extraout_RDX[3])
       || (*(long *)(extraout_RDX + 0xc) !=
           *(long *)(extraout_RDX + 10) * (long)(int)extraout_RDX[4])) goto LAB_00132bb5;
    iVar17 = extraout_RDX[3] * extraout_RDX[2] * extraout_RDX[4] * extraout_RDX[5];
    uVar3 = node_00->ne[0];
    uVar4 = node_00->ne[1];
    iVar1 = node_00->ne[2];
    lVar14 = (long)iVar1;
    uVar5 = node_00->ne[3];
    uVar15 = (ulong)uVar5;
    if (iVar17 != uVar5 * iVar1 * uVar4 * uVar3) goto LAB_00132bc9;
    if ((pgVar21->n_nodes & 0xfffffffdU) == 0) {
      return;
    }
    uVar11 = (ulong)uVar3;
    uVar19 = (ulong)uVar4;
    sVar6 = node_00->nb[0];
    sVar7 = node_00->nb[1];
    sVar8 = node_00->nb[2];
    sVar9 = node_00->nb[3];
    if (sVar6 != 2) {
      if (uVar18 == 5) {
        if ((int)uVar5 < 1) {
          return;
        }
        lVar12 = *(long *)(extraout_RDX + 0x24);
        lVar16 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar1) {
            lVar26 = 0;
            lVar24 = lVar16;
            do {
              if (0 < (int)uVar4) {
                uVar23 = 0;
                lVar22 = lVar24;
                do {
                  if (0 < (int)uVar3) {
                    puVar25 = (undefined2 *)((long)node_00->data + lVar22);
                    uVar27 = 0;
                    do {
                      *(undefined2 *)(lVar12 + (long)iVar17 * 2 + uVar27 * 2) = *puVar25;
                      uVar27 = uVar27 + 1;
                      puVar25 = (undefined2 *)((long)puVar25 + sVar6);
                    } while (uVar11 != uVar27);
                    iVar17 = iVar17 + (int)uVar27;
                  }
                  uVar23 = uVar23 + 1;
                  lVar22 = lVar22 + sVar7;
                } while (uVar23 != uVar19);
              }
              lVar26 = lVar26 + 1;
              lVar24 = lVar24 + sVar8;
            } while (lVar26 != lVar14);
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      if (uVar2 == 6) {
        if (0 < (int)uVar5) {
          lVar12 = *(long *)(extraout_RDX + 0x24);
          lVar16 = 0;
          uVar18 = 0;
          iVar17 = 0;
          do {
            if (0 < iVar1) {
              lVar26 = 0;
              lVar24 = lVar16;
              do {
                if (0 < (int)uVar4) {
                  uVar23 = 0;
                  lVar22 = lVar24;
                  do {
                    if (0 < (int)uVar3) {
                      puVar20 = (ushort *)((long)node_00->data + lVar22);
                      uVar27 = 0;
                      do {
                        *(float *)(lVar12 + (long)iVar17 * 4 + uVar27 * 4) = table_f32_f16[*puVar20]
                        ;
                        uVar27 = uVar27 + 1;
                        puVar20 = (ushort *)((long)puVar20 + sVar6);
                      } while (uVar11 != uVar27);
                      iVar17 = iVar17 + (int)uVar27;
                    }
                    uVar23 = uVar23 + 1;
                    lVar22 = lVar22 + sVar7;
                  } while (uVar23 != uVar19);
                }
                lVar26 = lVar26 + 1;
                lVar24 = lVar24 + sVar8;
              } while (lVar26 != lVar14);
            }
            uVar18 = uVar18 + 1;
            lVar16 = lVar16 + sVar9;
          } while (uVar18 != uVar15);
          return;
        }
        return;
      }
      goto LAB_00132bd8;
    }
    sVar28 = (long)(int)uVar3 * 2;
    if (((uVar2 == 5) && (sVar7 == sVar28)) &&
       ((sVar8 == sVar7 * (long)(int)uVar4 && (sVar13 = 1, sVar9 == sVar8 * lVar14)))) {
LAB_001326c7:
      memcpy(*(void **)(extraout_RDX + 0x24),node_00->data,(long)iVar17 << sVar13);
      return;
    }
    if (uVar18 == 6) {
      if (0 < (int)uVar5) {
        lVar12 = *(long *)(extraout_RDX + 0x24);
        lVar16 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar1) {
            lVar26 = 0;
            lVar24 = lVar16;
            do {
              if (0 < (int)uVar4) {
                uVar23 = 0;
                lVar22 = lVar24;
                do {
                  if (0 < (int)uVar3) {
                    pvVar10 = node_00->data;
                    uVar27 = 0;
                    do {
                      *(float *)(lVar12 + (long)iVar17 * 4 + uVar27 * 4) =
                           table_f32_f16[*(ushort *)((long)pvVar10 + uVar27 * 2 + lVar22)];
                      uVar27 = uVar27 + 1;
                    } while (uVar11 != uVar27);
                    iVar17 = iVar17 + (int)uVar27;
                  }
                  uVar23 = uVar23 + 1;
                  lVar22 = lVar22 + sVar7;
                } while (uVar23 != uVar19);
              }
              lVar26 = lVar26 + 1;
              lVar24 = lVar24 + sVar8;
            } while (lVar26 != lVar14);
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
    if (uVar2 == 5) {
      if (0 < (int)uVar5) {
        lStack_80 = 0;
        uStack_70 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar1) {
            lVar16 = 0;
            lVar12 = lStack_80;
            do {
              if (0 < (int)uVar4) {
                lVar26 = sVar28 * (long)iVar17;
                iVar17 = iVar17 + uVar4;
                uVar18 = uVar19;
                lVar24 = lVar12;
                do {
                  memcpy((void *)(*(long *)(extraout_RDX + 0x24) + lVar26),
                         (void *)((long)node_00->data + lVar24),sVar28);
                  lVar24 = lVar24 + sVar7;
                  lVar26 = lVar26 + sVar28;
                  uVar18 = uVar18 - 1;
                } while (uVar18 != 0);
              }
              lVar16 = lVar16 + 1;
              lVar12 = lVar12 + sVar8;
            } while (lVar16 != lVar14);
          }
          uStack_70 = uStack_70 + 1;
          lStack_80 = lStack_80 + sVar9;
        } while (uStack_70 != uVar15);
        return;
      }
      return;
    }
    break;
  case GGML_TYPE_F32:
    if (pgVar21->n_leafs != 0) goto LAB_00132bc4;
    uVar2 = *extraout_RDX;
    uVar18 = (ulong)uVar2;
    if (*(size_t *)(extraout_RDX + 6) != GGML_TYPE_SIZE[uVar18]) {
LAB_00132bba:
      ggml_compute_forward_dup_cold_3();
      goto LAB_00132bbf;
    }
    if (*(ulong *)(extraout_RDX + 8) !=
        (*(size_t *)(extraout_RDX + 6) * (long)(int)extraout_RDX[2]) /
        (ulong)(long)GGML_BLCK_SIZE[uVar18]) goto LAB_00132bba;
    if ((*(long *)(extraout_RDX + 10) != *(ulong *)(extraout_RDX + 8) * (long)(int)extraout_RDX[3])
       || (*(long *)(extraout_RDX + 0xc) !=
           *(long *)(extraout_RDX + 10) * (long)(int)extraout_RDX[4])) goto LAB_00132bba;
    iVar17 = extraout_RDX[3] * extraout_RDX[2] * extraout_RDX[4] * extraout_RDX[5];
    uVar3 = node_00->ne[0];
    uVar4 = node_00->ne[1];
    iVar1 = node_00->ne[2];
    lVar14 = (long)iVar1;
    uVar5 = node_00->ne[3];
    uVar15 = (ulong)uVar5;
    if (iVar17 != uVar5 * iVar1 * uVar4 * uVar3) goto LAB_00132bce;
    if ((pgVar21->n_nodes & 0xfffffffdU) == 0) {
      return;
    }
    uVar11 = (ulong)uVar3;
    uVar19 = (ulong)uVar4;
    sVar6 = node_00->nb[0];
    sVar7 = node_00->nb[1];
    sVar8 = node_00->nb[2];
    sVar9 = node_00->nb[3];
    if (sVar6 == 4) {
      sVar28 = (long)(int)uVar3 * 4;
      if ((((uVar2 == 6) && (sVar7 == sVar28)) && (sVar8 == sVar7 * (long)(int)uVar4)) &&
         (sVar13 = 2, sVar9 == sVar8 * lVar14)) goto LAB_001326c7;
      if (uVar18 == 5) {
        if (0 < (int)uVar5) {
          lVar12 = 0;
          uVar18 = 0;
          do {
            if (0 < iVar1) {
              lVar24 = 0;
              lVar16 = lVar12;
              do {
                if (0 < (int)uVar4) {
                  uVar23 = 0;
                  lVar26 = lVar16;
                  do {
                    if (0 < (int)uVar3) {
                      uVar27 = 0;
                      do {
                        auVar31 = vcvtps2ph_f16c(ZEXT416(*(uint *)((long)node_00->data +
                                                                  uVar27 * 4 + lVar26)),0);
                        vpextrw_avx(auVar31,0);
                        uVar27 = uVar27 + 1;
                      } while (uVar11 != uVar27);
                    }
                    uVar23 = uVar23 + 1;
                    lVar26 = lVar26 + sVar7;
                  } while (uVar23 != uVar19);
                }
                lVar24 = lVar24 + 1;
                lVar16 = lVar16 + sVar8;
              } while (lVar24 != lVar14);
            }
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + sVar9;
          } while (uVar18 != uVar15);
          return;
        }
        return;
      }
      if (uVar2 == 6) {
        if (0 < (int)uVar5) {
          lStack_80 = 0;
          uStack_70 = 0;
          iVar17 = 0;
          do {
            if (0 < iVar1) {
              lVar16 = 0;
              lVar12 = lStack_80;
              do {
                if (0 < (int)uVar4) {
                  lVar26 = sVar28 * (long)iVar17;
                  iVar17 = iVar17 + uVar4;
                  uVar18 = uVar19;
                  lVar24 = lVar12;
                  do {
                    memcpy((void *)(*(long *)(extraout_RDX + 0x24) + lVar26),
                           (void *)((long)node_00->data + lVar24),sVar28);
                    lVar24 = lVar24 + sVar7;
                    lVar26 = lVar26 + sVar28;
                    uVar18 = uVar18 - 1;
                  } while (uVar18 != 0);
                }
                lVar16 = lVar16 + 1;
                lVar12 = lVar12 + sVar8;
              } while (lVar16 != lVar14);
            }
            uStack_70 = uStack_70 + 1;
            lStack_80 = lStack_80 + sVar9;
          } while (uStack_70 != uVar15);
          return;
        }
        return;
      }
      goto LAB_00132be2;
    }
    if (uVar18 == 5) {
      if (0 < (int)uVar5) {
        lVar12 = 0;
        uVar18 = 0;
        do {
          if (0 < iVar1) {
            lVar24 = 0;
            lVar16 = lVar12;
            do {
              if (0 < (int)uVar4) {
                uVar23 = 0;
                lVar26 = lVar16;
                do {
                  if (0 < (int)uVar3) {
                    puVar30 = (uint *)((long)node_00->data + lVar26);
                    uVar27 = 0;
                    do {
                      auVar31 = vcvtps2ph_f16c(ZEXT416(*puVar30),0);
                      vpextrw_avx(auVar31,0);
                      uVar27 = uVar27 + 1;
                      puVar30 = (uint *)((long)puVar30 + sVar6);
                    } while (uVar11 != uVar27);
                  }
                  uVar23 = uVar23 + 1;
                  lVar26 = lVar26 + sVar7;
                } while (uVar23 != uVar19);
              }
              lVar24 = lVar24 + 1;
              lVar16 = lVar16 + sVar8;
            } while (lVar24 != lVar14);
          }
          uVar18 = uVar18 + 1;
          lVar12 = lVar12 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
    if (uVar2 == 6) {
      if (0 < (int)uVar5) {
        lVar12 = *(long *)(extraout_RDX + 0x24);
        lVar16 = 0;
        uVar18 = 0;
        iVar17 = 0;
        do {
          if (0 < iVar1) {
            lVar26 = 0;
            lVar24 = lVar16;
            do {
              if (0 < (int)uVar4) {
                uVar23 = 0;
                lVar22 = lVar24;
                do {
                  if (0 < (int)uVar3) {
                    puVar29 = (undefined4 *)((long)node_00->data + lVar22);
                    uVar27 = 0;
                    do {
                      *(undefined4 *)(lVar12 + (long)iVar17 * 4 + uVar27 * 4) = *puVar29;
                      uVar27 = uVar27 + 1;
                      puVar29 = (undefined4 *)((long)puVar29 + sVar6);
                    } while (uVar11 != uVar27);
                    iVar17 = iVar17 + (int)uVar27;
                  }
                  uVar23 = uVar23 + 1;
                  lVar22 = lVar22 + sVar7;
                } while (uVar23 != uVar19);
              }
              lVar26 = lVar26 + 1;
              lVar24 = lVar24 + sVar8;
            } while (lVar26 != lVar14);
          }
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + sVar9;
        } while (uVar18 != uVar15);
        return;
      }
      return;
    }
LAB_00132bd3:
    ggml_compute_forward_dup_cold_5();
LAB_00132bd8:
    ggml_compute_forward_dup_cold_10();
    break;
  default:
    return;
  }
  ggml_compute_forward_dup_cold_11();
LAB_00132be2:
  ggml_compute_forward_dup_cold_6();
}

Assistant:

static void ggml_visit_parents(struct ggml_cgraph * cgraph, struct ggml_tensor * node) {
    if (node->grad == NULL) {
        // this usually happens when we generate intermediate nodes from constants in the backward pass
        // it can also happen during forward pass, if the user performs computations with constants
        if (node->op != GGML_OP_NONE) {
            //GGML_PRINT_DEBUG("%s: warning: node %p has no grad, but op %d\n", __func__, (void *) node, node->op);
        }
    }

    // check if already visited
    for (int i = 0; i < cgraph->n_nodes; i++) {
        if (cgraph->nodes[i] == node) {
            return;
        }
    }

    for (int i = 0; i < cgraph->n_leafs; i++) {
        if (cgraph->leafs[i] == node) {
            return;
        }
    }

    if (node->src0) {
        ggml_visit_parents(cgraph, node->src0);
    }

    if (node->src1) {
        ggml_visit_parents(cgraph, node->src1);
    }

    for (int i = 0; i < GGML_MAX_OPT; ++i) {
        if (node->opt[i]) {
            ggml_visit_parents(cgraph, node->opt[i]);
        }
    }

    if (node->op == GGML_OP_NONE && node->grad == NULL) {
        // reached a leaf node, not part of the gradient graph (e.g. a constant)
        GGML_ASSERT(cgraph->n_leafs < GGML_MAX_NODES);

        cgraph->leafs[cgraph->n_leafs] = node;
        cgraph->n_leafs++;
    } else {
        GGML_ASSERT(cgraph->n_nodes < GGML_MAX_NODES);

        cgraph->nodes[cgraph->n_nodes] = node;
        cgraph->grads[cgraph->n_nodes] = node->grad;
        cgraph->n_nodes++;
    }
}